

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

int64_t __thiscall obx::Transaction::getDataSizeChange(Transaction *this)

{
  obx_err err;
  OBX_txn *pOVar1;
  int64_t sizeChange;
  int64_t local_10;
  
  local_10 = 0;
  pOVar1 = cPtr(this);
  err = obx_txn_data_size(pOVar1,0,&local_10);
  internal::checkErrOrThrow(err);
  return local_10;
}

Assistant:

int64_t Transaction::getDataSizeChange() const {
    int64_t sizeChange = 0;
    internal::checkErrOrThrow(obx_txn_data_size(cPtr(), nullptr, &sizeChange));
    return sizeChange;
}